

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O0

void __thiscall gui::Slider::setLabel(Slider *this,shared_ptr<gui::Label> *label)

{
  bool bVar1;
  Widget *in_RDI;
  float unaff_retaddr;
  Widget *in_stack_00000008;
  Signal<gui::Widget_*,_float> *in_stack_00000010;
  shared_ptr<gui::Label> *in_stack_ffffffffffffffd8;
  
  std::shared_ptr<gui::Label>::operator=((shared_ptr<gui::Label> *)in_RDI,in_stack_ffffffffffffffd8)
  ;
  bVar1 = std::operator!=((shared_ptr<gui::Label> *)in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    Signal<gui::Widget_*,_float>::emit(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  Widget::requestRedraw(in_RDI);
  return;
}

Assistant:

void Slider::setLabel(std::shared_ptr<Label> label) {
    label_ = label;
    if (label != nullptr) {
        onValueChange.emit(this, value_);
    }
    requestRedraw();
}